

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_http_server.c
# Opt level: O2

cio_http_location_handler * alloc_dummy_handler(void *config)

{
  cio_http_location_handler *handler;
  
  if (config == (void *)0x1) {
    sub_location_handler_called();
  }
  else if (config == (void *)0x0) {
    location_handler_called();
  }
  handler = (cio_http_location_handler *)malloc(0xa8);
  if (handler != (cio_http_location_handler *)0x0) {
    cio_http_location_handler_init(handler);
    handler[1].on_schema = (cio_http_data_cb_t)(handler + 1);
    handler[1].on_url = (cio_http_data_cb_t)(handler + 1);
    handler[1].on_host = (cio_http_data_cb_t)0x0;
    handler[1].on_port = (cio_http_data_cb_t)0x0;
    handler->free = free_dummy_handler;
    handler->on_headers_complete = header_complete;
    handler->on_message_complete = message_complete;
  }
  return handler;
}

Assistant:

static struct cio_http_location_handler *alloc_dummy_handler(const void *config)
{
	uintptr_t location = (uintptr_t)config;
	if (location == 0) {
		location_handler_called();
	} else if (location == 1) {
		sub_location_handler_called();
	}

	struct dummy_handler *handler = malloc(sizeof(*handler));
	if (cio_unlikely(handler == NULL)) {
		return NULL;
	} else {
		cio_http_location_handler_init(&handler->handler);
		cio_write_buffer_head_init(&handler->wbh);
		handler->handler.free = free_dummy_handler;
		handler->handler.on_headers_complete = header_complete;
		handler->handler.on_message_complete = message_complete;
		return &handler->handler;
	}
}